

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gmock-matchers.h
# Opt level: O2

bool __thiscall
testing::internal::
ContainerEqMatcher<google::sparsetable<int,(unsigned_short)48,google::libc_allocator_with_realloc<int>>>
::
MatchAndExplain<google::sparsetable<int,(unsigned_short)48,google::libc_allocator_with_realloc<int>>>
          (ContainerEqMatcher<google::sparsetable<int,(unsigned_short)48,google::libc_allocator_with_realloc<int>>>
           *this,sparsetable<int,_(unsigned_short)48,_google::libc_allocator_with_realloc<int>_>
                 *lhs,MatchResultListener *listener)

{
  ostream *os;
  size_type sVar1;
  size_type sVar2;
  bool bVar3;
  reference piVar4;
  ostream *poVar5;
  char *pcVar6;
  bool bVar7;
  const_table_iterator<google::sparsetable<int,_(unsigned_short)48,_google::libc_allocator_with_realloc<int>_>_>
  cVar8;
  const_table_iterator<google::sparsetable<int,_(unsigned_short)48,_google::libc_allocator_with_realloc<int>_>_>
  begin;
  const_table_iterator<google::sparsetable<int,_(unsigned_short)48,_google::libc_allocator_with_realloc<int>_>_>
  end;
  const_table_iterator<google::sparsetable<int,_(unsigned_short)48,_google::libc_allocator_with_realloc<int>_>_>
  end_00;
  const_table_iterator<google::sparsetable<int,_(unsigned_short)48,_google::libc_allocator_with_realloc<int>_>_>
  local_48;
  char *local_38;
  
  bVar3 = google::sparsetable<int,_(unsigned_short)48,_google::libc_allocator_with_realloc<int>_>::
          operator==(lhs,(sparsetable<int,_(unsigned_short)48,_google::libc_allocator_with_realloc<int>_>
                          *)this);
  if ((!bVar3) && (os = listener->stream_, os != (ostream *)0x0)) {
    bVar7 = false;
    local_48.table = lhs;
    for (local_48.pos = 0; (local_48.table != lhs || (local_48.pos != (lhs->settings).table_size));
        local_48.pos = local_48.pos + 1) {
      sVar1 = *(size_type *)(this + 0x18);
      piVar4 = google::
               const_table_iterator<google::sparsetable<int,_(unsigned_short)48,_google::libc_allocator_with_realloc<int>_>_>
               ::operator*(&local_48);
      cVar8.pos = 0;
      cVar8.table = (sparsetable<int,_(unsigned_short)48,_google::libc_allocator_with_realloc<int>_>
                     *)this;
      end.pos = sVar1;
      end.table = (sparsetable<int,_(unsigned_short)48,_google::libc_allocator_with_realloc<int>_> *
                  )this;
      cVar8 = ArrayAwareFind<google::const_table_iterator<google::sparsetable<int,(unsigned_short)48,google::libc_allocator_with_realloc<int>>>,int>
                        (cVar8,end,piVar4);
      if ((cVar8.table ==
           (sparsetable<int,_(unsigned_short)48,_google::libc_allocator_with_realloc<int>_> *)this)
         && (cVar8.pos == *(size_type *)(this + 0x18))) {
        pcVar6 = "which has these unexpected elements: ";
        if (bVar7) {
          pcVar6 = ", ";
        }
        else {
          bVar7 = true;
        }
        std::operator<<(os,pcVar6);
        piVar4 = google::
                 const_table_iterator<google::sparsetable<int,_(unsigned_short)48,_google::libc_allocator_with_realloc<int>_>_>
                 ::operator*(&local_48);
        internal_stream_operator_without_lexical_name_lookup::StreamPrinter::
        PrintValue<int,void,std::ostream&>(piVar4,os);
      }
    }
    local_38 = "which";
    if (bVar7) {
      local_38 = ",\nand";
    }
    bVar7 = false;
    local_48.table =
         (sparsetable<int,_(unsigned_short)48,_google::libc_allocator_with_realloc<int>_> *)this;
    for (local_48.pos = 0;
        (local_48.table !=
         (sparsetable<int,_(unsigned_short)48,_google::libc_allocator_with_realloc<int>_> *)this ||
        (local_48.pos != *(size_type *)(this + 0x18))); local_48.pos = local_48.pos + 1) {
      sVar2 = (lhs->settings).table_size;
      piVar4 = google::
               const_table_iterator<google::sparsetable<int,_(unsigned_short)48,_google::libc_allocator_with_realloc<int>_>_>
               ::operator*(&local_48);
      begin.pos = 0;
      begin.table = lhs;
      end_00.pos = sVar2;
      end_00.table = lhs;
      cVar8 = ArrayAwareFind<google::const_table_iterator<google::sparsetable<int,(unsigned_short)48,google::libc_allocator_with_realloc<int>>>,int>
                        (begin,end_00,piVar4);
      if ((cVar8.table == lhs) && (cVar8.pos == (lhs->settings).table_size)) {
        if (bVar7) {
          pcVar6 = ", ";
          poVar5 = os;
        }
        else {
          poVar5 = std::operator<<(os,local_38);
          pcVar6 = " doesn\'t have these expected elements: ";
        }
        std::operator<<(poVar5,pcVar6);
        piVar4 = google::
                 const_table_iterator<google::sparsetable<int,_(unsigned_short)48,_google::libc_allocator_with_realloc<int>_>_>
                 ::operator*(&local_48);
        internal_stream_operator_without_lexical_name_lookup::StreamPrinter::
        PrintValue<int,void,std::ostream&>(piVar4,os);
        bVar7 = true;
      }
    }
  }
  return bVar3;
}

Assistant:

bool MatchAndExplain(const LhsContainer& lhs,
                       MatchResultListener* listener) const {
    typedef internal::StlContainerView<
        typename std::remove_const<LhsContainer>::type>
        LhsView;
    StlContainerReference lhs_stl_container = LhsView::ConstReference(lhs);
    if (lhs_stl_container == expected_) return true;

    ::std::ostream* const os = listener->stream();
    if (os != nullptr) {
      // Something is different. Check for extra values first.
      bool printed_header = false;
      for (auto it = lhs_stl_container.begin(); it != lhs_stl_container.end();
           ++it) {
        if (internal::ArrayAwareFind(expected_.begin(), expected_.end(), *it) ==
            expected_.end()) {
          if (printed_header) {
            *os << ", ";
          } else {
            *os << "which has these unexpected elements: ";
            printed_header = true;
          }
          UniversalPrint(*it, os);
        }
      }

      // Now check for missing values.
      bool printed_header2 = false;
      for (auto it = expected_.begin(); it != expected_.end(); ++it) {
        if (internal::ArrayAwareFind(lhs_stl_container.begin(),
                                     lhs_stl_container.end(),
                                     *it) == lhs_stl_container.end()) {
          if (printed_header2) {
            *os << ", ";
          } else {
            *os << (printed_header ? ",\nand" : "which")
                << " doesn't have these expected elements: ";
            printed_header2 = true;
          }
          UniversalPrint(*it, os);
        }
      }
    }

    return false;
  }